

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# osportable.cc
# Opt level: O2

size_t os_get_root_dirs(char *buf,size_t buflen)

{
  if (2 < buflen) {
    buf[2] = '\0';
    buf[0] = '/';
    buf[1] = '\0';
  }
  return 3;
}

Assistant:

size_t os_get_root_dirs(char *buf, size_t buflen)
{
    static const char ret[] = { '/', 0, 0 };
    
    // if there's room, copy the root string "/" and an extra null
    // terminator for the overall list
    if (buflen >= sizeof(ret))
        memcpy(buf, ret, sizeof(ret));

    // return the required size
    return sizeof(ret);
}